

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void LiteScript::Instruction::SaveBinary
               (ostream *stream,
               vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instr)

{
  size_type sVar1;
  const_reference pvVar2;
  OStreamer *pOVar3;
  ostream *poVar4;
  uchar local_34 [2];
  byte local_32;
  uchar local_31;
  uint local_30;
  uint local_2c;
  uint sz;
  uint i;
  OStreamer local_20;
  OStreamer streamer;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instr_local;
  ostream *stream_local;
  
  streamer.stream = (ostream *)instr;
  OStreamer::OStreamer(&local_20,stream);
  _sz = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::size
                  ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)
                   streamer.stream);
  OStreamer::operator<<(&local_20,(unsigned_long *)&sz);
  local_2c = 0;
  sVar1 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::size
                    ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)
                     streamer.stream);
  local_30 = (uint)sVar1;
  do {
    if (local_30 <= local_2c) {
      return;
    }
    pvVar2 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
             operator[]((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *
                        )streamer.stream,(ulong)local_2c);
    std::operator<<(stream,pvVar2->code);
    pvVar2 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
             operator[]((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *
                        )streamer.stream,(ulong)local_2c);
    switch(pvVar2->comp_type) {
    case '\x01':
      local_31 = '\x01';
      pOVar3 = OStreamer::operator<<(&local_20,&local_31);
      pvVar2 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
               operator[]((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                           *)streamer.stream,(ulong)local_2c);
      local_32 = (pvVar2->comp_value).v_boolean & 1;
      OStreamer::operator<<(pOVar3,&local_32);
      break;
    case '\x02':
      local_34[1] = 2;
      pOVar3 = OStreamer::operator<<(&local_20,local_34 + 1);
      pvVar2 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
               operator[]((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                           *)streamer.stream,(ulong)local_2c);
      OStreamer::operator<<(pOVar3,&(pvVar2->comp_value).v_integer);
      break;
    case '\x03':
      local_34[0] = '\x03';
      pOVar3 = OStreamer::operator<<(&local_20,local_34);
      pvVar2 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
               operator[]((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                           *)streamer.stream,(ulong)local_2c);
      OStreamer::operator<<(pOVar3,&(pvVar2->comp_value).v_float);
      break;
    case '\x04':
      poVar4 = std::operator<<(stream,'\x04');
      pvVar2 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
               operator[]((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                           *)streamer.stream,(ulong)local_2c);
      std::operator<<(poVar4,(pvVar2->comp_value).v_string);
    default:
      std::operator<<(stream,'\0');
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

void LiteScript::Instruction::SaveBinary(std::ostream &stream, const std::vector<Instruction> &instr) {
    OStreamer streamer(stream);
    streamer << instr.size();
    for (unsigned int i = 0, sz = instr.size(); i < sz; i++) {
        stream << instr[i].code;
        switch (instr[i].comp_type) {
            case CompType::COMP_TYPE_BOOLEAN:
                streamer << (unsigned char)1 << (unsigned char)instr[i].comp_value.v_boolean;
                break;
            case CompType::COMP_TYPE_INTEGER:
                streamer << (unsigned char)2 << instr[i].comp_value.v_integer;
                break;
            case CompType::COMP_TYPE_FLOAT:
                streamer << (unsigned char)3 << instr[i].comp_value.v_float;
                break;
            case CompType::COMP_TYPE_STRING:
                stream << (unsigned char)4 << instr[i].comp_value.v_string;
            default:
                stream << (unsigned char)0;
        }
    }
}